

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O3

void __thiscall CGameClient::OnNewSnapshot(CGameClient *this)

{
  bool *pbVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  long lVar4;
  CNetObj_SpectatorInfo *pCVar5;
  CNetObj_GameData *pCVar6;
  CNetObj_PlayerInfo *pCVar7;
  vec2 vVar8;
  vec2 Pos;
  undefined8 uVar9;
  CCharacterInfo *pCVar10;
  char cVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  undefined4 extraout_var;
  char *pcVar16;
  CNetObj_GameDataFlag *pCVar17;
  undefined4 extraout_var_01;
  int *piVar18;
  undefined4 extraout_var_03;
  undefined8 *puVar19;
  CNetObj_PlayerInfo **ppCVar20;
  long lVar21;
  long lVar22;
  char (*pacVar23) [97];
  int p;
  CSnapItem *pCVar24;
  long lVar25;
  CNetObj_GameDataFlag *pCVar26;
  int *piVar27;
  CNetObj_Character *pCVar28;
  CNetObj_Character *pCVar29;
  CTuningParams *pCVar30;
  long lVar31;
  CNetObj_Character *pCVar32;
  CNetObj_Character *pCVar33;
  IClient *pIVar34;
  uint uVar35;
  ulong uVar36;
  CNetObj_De_ClientInfo *pInfo;
  code *pcVar37;
  CClientData *this_00;
  int k;
  int iVar38;
  long in_FS_OFFSET;
  byte bVar39;
  CSnapItem Item;
  CServerInfo CurrentServerInfo;
  undefined4 extraout_var_00;
  undefined4 extraout_var_02;
  
  bVar39 = 0;
  CurrentServerInfo.m_aClients[0x21].m_aName[8] = '\0';
  CurrentServerInfo.m_aClients[0x21].m_aName[9] = '\0';
  CurrentServerInfo.m_aClients[0x21].m_aName[10] = '\0';
  CurrentServerInfo.m_aClients[0x21].m_aName[0xb] = '\0';
  CurrentServerInfo.m_aClients[0x21].m_aName[0xc] = '\0';
  CurrentServerInfo.m_aClients[0x21].m_aName[0xd] = '\0';
  CurrentServerInfo.m_aClients[0x21].m_aName[0xe] = '\0';
  CurrentServerInfo.m_aClients[0x21].m_aName[0xf] = '\0';
  CurrentServerInfo.m_aClients[2].m_aName[4] = '\0';
  CurrentServerInfo.m_aClients[2].m_aName[5] = '\0';
  CurrentServerInfo.m_aClients[2].m_aName[6] = '\0';
  CurrentServerInfo.m_aClients[2].m_aName[7] = '\0';
  CurrentServerInfo.m_aClients[2].m_aName[8] = '\0';
  CurrentServerInfo.m_aClients[2].m_aName[9] = '\0';
  CurrentServerInfo.m_aClients[2].m_aName[10] = '\0';
  CurrentServerInfo.m_aClients[2].m_aName[0xb] = '\0';
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  mem_zero(&this->m_Snap,0x3780);
  uVar12 = (*(this->m_pClient->super_IInterface)._vptr_IInterface[0x1e])();
  if (0 < (int)uVar12) {
    uVar36 = 0;
    do {
      iVar13 = (*(this->m_pClient->super_IInterface)._vptr_IInterface[0x20])
                         (this->m_pClient,0,uVar36,&Item);
      iVar13 = CNetObjHandler::ValidateObj
                         (&this->m_NetObjHandler,Item.m_Type,(void *)CONCAT44(extraout_var,iVar13),
                          Item.m_DataSize);
      uVar9 = Item._0_8_;
      if (iVar13 != 0) {
        if (this->m_pConfig->m_Debug != 0) {
          pcVar16 = CNetObjHandler::GetObjName(&this->m_NetObjHandler,Item.m_Type);
          str_format((char *)&CurrentServerInfo,0x100,
                     "invalidated index=%d type=%d (%s) size=%d id=%d",uVar36,uVar9 & 0xffffffff,
                     pcVar16,(ulong)stack0xffffffffffffdcc0 & 0xffffffff,(ulong)Item._0_8_ >> 0x20);
          (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                    (this->m_pConsole,2,"game",&CurrentServerInfo,0);
        }
        (*(this->m_pClient->super_IInterface)._vptr_IInterface[0x21])(this->m_pClient,0,uVar36);
      }
      uVar35 = (int)uVar36 + 1;
      uVar36 = (ulong)uVar35;
    } while (uVar12 != uVar35);
  }
  ProcessEvents(this);
  pIVar34 = this->m_pClient;
  if ((this->m_pConfig->m_DbgStress != 0) &&
     ((pIVar34->m_CurGameTick * -0x3d70a3d7 + 0x51eb850U >> 2 | pIVar34->m_CurGameTick * 0x40000000)
      < 0x28f5c29)) {
    uVar12 = rand();
    uVar35 = rand();
    uVar12 = (uVar12 & 0x7fff) << 0x10 | uVar35 & 0xffff;
    uVar12 = uVar12 / 0x3f + (uVar12 / 0x3f) * -0x40 + uVar12;
    if (uVar12 != 0) {
      uVar36 = 0;
      do {
        uVar35 = rand();
        uVar14 = rand();
        CurrentServerInfo.m_NetAddr.ip[uVar36 - 8] =
             (char)uVar14 + (char)(((uVar35 & 0x7fff) << 0x10 | uVar14 & 0xffff) / 0x19) * -0x19 +
             'a';
        uVar36 = uVar36 + 1;
      } while (uVar36 < uVar12);
    }
    CurrentServerInfo.m_NetAddr.ip[(ulong)uVar12 - 8] = '\0';
    rand();
    uVar12 = rand();
    Item.m_ID = -1;
    Item.m_Type = uVar12 & 1;
    unique0x00005300 = &CurrentServerInfo;
    IClient::SendPackMsg<CNetMsg_Cl_Say>(this->m_pClient,(CNetMsg_Cl_Say *)&Item,1);
    pIVar34 = this->m_pClient;
  }
  Item.m_Type = 1000;
  Item.m_ID = 200;
  stack0xffffffffffffdcc0 = (CServerInfo *)0x52800000032;
  if (pIVar34->m_State == 4) {
    pCVar24 = &Item;
    pCVar30 = &this->m_Tuning;
    for (lVar21 = 0x10; lVar21 != 0; lVar21 = lVar21 + -1) {
      iVar13 = pCVar24->m_ID;
      pCVar30->m_GroundControlSpeed = (CTuneParam)pCVar24->m_Type;
      pCVar30->m_GroundControlAccel = (CTuneParam)iVar13;
      pCVar24 = (CSnapItem *)((long)pCVar24 + (ulong)bVar39 * -0x10 + 8);
      pCVar30 = (CTuningParams *)((long)pCVar30 + (ulong)bVar39 * -0x10 + 8);
    }
    mem_zero(&this->m_GameInfo,0x20);
    pIVar34 = this->m_pClient;
  }
  uVar12 = (*(pIVar34->super_IInterface)._vptr_IInterface[0x1e])();
  if (0 < (int)uVar12) {
    uVar36 = 0;
    do {
      iVar13 = (*(this->m_pClient->super_IInterface)._vptr_IInterface[0x20])
                         (this->m_pClient,0,uVar36,&CurrentServerInfo);
      pCVar17 = (CNetObj_GameDataFlag *)CONCAT44(extraout_var_00,iVar13);
      if (this->m_pClient->m_State == 4) {
        if (CurrentServerInfo.m_ServerIndex == 0xf) {
          mem_copy(&this->m_Tuning,pCVar17,0x80);
          this->m_ServerMode = 0;
          goto LAB_00183af7;
        }
        if (CurrentServerInfo.m_ServerIndex == 0xe) {
          iVar13 = pCVar17->m_FlagCarrierBlue;
          uVar9 = *(undefined8 *)&pCVar17->m_FlagDropTickRed;
          (this->m_GameInfo).m_GameFlags = pCVar17->m_FlagCarrierRed;
          (this->m_GameInfo).m_ScoreLimit = iVar13;
          (this->m_GameInfo).m_TimeLimit = (int)uVar9;
          (this->m_GameInfo).m_MatchNum = (int)((ulong)uVar9 >> 0x20);
          (this->m_GameInfo).m_MatchCurrent = pCVar17[1].m_FlagCarrierRed;
        }
        else {
          if (CurrentServerInfo.m_ServerIndex != 0xd) goto LAB_00183af7;
          lVar21 = (long)(int)CurrentServerInfo.m_NetAddr.type;
          if (lVar21 < 0x40) {
            if (pCVar17->m_FlagCarrierRed != 0) {
              this->m_LocalClientID = CurrentServerInfo.m_NetAddr.type;
            }
            this->m_aClients[lVar21].m_Active = true;
            this->m_aClients[lVar21].m_Team = pCVar17->m_FlagCarrierBlue;
            lVar25 = 0;
            do {
              lVar22 = lVar25;
              this->m_aClients[lVar21].m_aName[lVar22 * 4] =
                   *(char *)((long)&pCVar17->m_FlagDropTickRed + lVar22 * 4 + 3) + -0x80;
              this->m_aClients[lVar21].m_aName[lVar22 * 4 + 1] =
                   *(char *)((long)&pCVar17->m_FlagDropTickRed + lVar22 * 4 + 2) + -0x80;
              this->m_aClients[lVar21].m_aName[lVar22 * 4 + 2] =
                   *(char *)((long)&pCVar17->m_FlagDropTickRed + lVar22 * 4 + 1) + -0x80;
              this->m_aClients[lVar21].m_aName[lVar22 * 4 + 3] =
                   (char)(&pCVar17->m_FlagDropTickRed)[lVar22] + -0x80;
              lVar25 = lVar22 + 1;
            } while ((int)(lVar22 + 1) != 4);
            this->m_aClients[lVar21].m_aName[lVar22 * 4 + 3] = '\0';
            lVar25 = 0;
            do {
              lVar22 = lVar25;
              this->m_aClients[lVar21].m_aClan[lVar22 * 4] =
                   *(char *)((long)&pCVar17[1].m_FlagDropTickRed + lVar22 * 4 + 3) + -0x80;
              this->m_aClients[lVar21].m_aClan[lVar22 * 4 + 1] =
                   *(char *)((long)&pCVar17[1].m_FlagDropTickRed + lVar22 * 4 + 2) + -0x80;
              this->m_aClients[lVar21].m_aClan[lVar22 * 4 + 2] =
                   *(char *)((long)&pCVar17[1].m_FlagDropTickRed + lVar22 * 4 + 1) + -0x80;
              this->m_aClients[lVar21].m_aClan[lVar22 * 4 + 3] =
                   (char)(&pCVar17[1].m_FlagDropTickRed)[lVar22] + -0x80;
              lVar25 = lVar22 + 1;
            } while ((int)(lVar22 + 1) != 3);
            this->m_aClients[lVar21].m_aClan[lVar22 * 4 + 3] = '\0';
            this->m_aClients[lVar21].m_Country = pCVar17[2].m_FlagCarrierBlue;
            piVar18 = &pCVar17[2].m_FlagDropTickRed;
            pacVar23 = this->m_aClients[lVar21].m_aaSkinPartNames;
            lVar25 = 0;
            do {
              lVar22 = 0;
              do {
                lVar31 = lVar22;
                (*pacVar23)[lVar31 * 4] = *(char *)((long)piVar18 + lVar31 * 4 + 3) + -0x80;
                (*pacVar23)[lVar31 * 4 + 1] = *(char *)((long)piVar18 + lVar31 * 4 + 2) + -0x80;
                (*pacVar23)[lVar31 * 4 + 2] = *(char *)((long)piVar18 + lVar31 * 4 + 1) + -0x80;
                (*pacVar23)[lVar31 * 4 + 3] = (char)piVar18[lVar31] + -0x80;
                lVar22 = lVar31 + 1;
              } while ((int)(lVar31 + 1) != 6);
              (*pacVar23)[lVar31 * 4 + 3] = '\0';
              this->m_aClients[lVar21].m_aUseCustomColors[lVar25] =
                   (&pCVar17[0xb].m_FlagDropTickRed)[lVar25];
              this->m_aClients[lVar21].m_aSkinPartColors[lVar25] =
                   (&pCVar17[0xd].m_FlagCarrierRed)[lVar25];
              lVar25 = lVar25 + 1;
              pacVar23 = pacVar23 + 1;
              piVar18 = piVar18 + 6;
            } while (lVar25 != 6);
            piVar18 = &(this->m_GameInfo).m_NumPlayers;
            *piVar18 = *piVar18 + 1;
            lVar21 = (long)this->m_aClients[lVar21].m_Team;
            if (lVar21 != -1) {
              piVar18 = (this->m_GameInfo).m_aTeamSize + lVar21;
              *piVar18 = *piVar18 + 1;
            }
          }
        }
      }
      else {
LAB_00183af7:
        switch(CurrentServerInfo.m_ServerIndex) {
        case 5:
          (this->m_Snap).m_paFlags[(int)CurrentServerInfo.m_NetAddr.type % 2] =
               (CNetObj_Flag *)pCVar17;
          break;
        case 6:
          (this->m_Snap).m_pGameData = (CNetObj_GameData *)pCVar17;
          uVar35 = pCVar17->m_FlagCarrierBlue;
          if ((((OnNewSnapshot::s_LastGameFlags & 8U) == 0) && (lVar21 = 0xc0, (uVar35 & 8) != 0))
             || (((OnNewSnapshot::s_LastGameFlags & 8U) != 0 && (lVar21 = 200, (uVar35 & 8) == 0))))
          {
            (**(code **)((long)(this->super_IGameClient).super_IInterface._vptr_IInterface + lVar21)
            )(this);
          }
          if (((((this->m_Snap).m_pGameData)->m_GameStartTick != this->m_LastGameStartTick) &&
              ((OnNewSnapshot::s_LastGameFlags & 0x14U) == 0)) && ((uVar35 & 0x30) != 0x10)) {
            CStats::OnMatchStart(this->m_pStats);
          }
          if ((uVar35 & 0x1c) == 0) {
            CStats::UpdatePlayTime
                      (this->m_pStats,
                       this->m_pClient->m_CurGameTick - this->m_pClient->m_PrevGameTick);
          }
          OnNewSnapshot::s_LastGameFlags = uVar35;
          this->m_LastGameStartTick = ((this->m_Snap).m_pGameData)->m_GameStartTick;
          break;
        case 7:
          (this->m_Snap).m_pGameDataTeam = (CNetObj_GameDataTeam *)pCVar17;
          break;
        case 8:
          (this->m_Snap).m_pGameDataFlag = pCVar17;
          (this->m_Snap).m_GameDataFlagSnapID = CurrentServerInfo.m_NetAddr.type;
          if (((this->m_LastFlagCarrierRed == -2) &&
              (iVar13 = pCVar17->m_FlagCarrierRed, -1 < iVar13)) ||
             ((this->m_LastFlagCarrierBlue == -2 &&
              (iVar13 = pCVar17->m_FlagCarrierBlue, -1 < iVar13)))) {
            CStats::OnFlagGrab(this->m_pStats,iVar13);
          }
          pCVar17 = (this->m_Snap).m_pGameDataFlag;
          iVar13 = pCVar17->m_FlagCarrierBlue;
          this->m_LastFlagCarrierRed = pCVar17->m_FlagCarrierRed;
          this->m_LastFlagCarrierBlue = iVar13;
          break;
        case 10:
          lVar21 = (long)(int)CurrentServerInfo.m_NetAddr.type;
          if (lVar21 < 0x40) {
            pbVar1 = &(this->m_Snap).m_aCharacters[lVar21].m_Active;
            iVar13 = (*(this->m_pClient->super_IInterface)._vptr_IInterface[0x1f])
                               (this->m_pClient,1,10);
            piVar18 = (int *)CONCAT44(extraout_var_02,iVar13);
            pCVar33 = &(this->m_Snap).m_aCharacters[lVar21].m_Cur;
            pCVar26 = pCVar17;
            pCVar29 = pCVar33;
            for (lVar25 = 0x16; lVar25 != 0; lVar25 = lVar25 + -1) {
              (pCVar29->super_CNetObj_CharacterCore).m_Tick = pCVar26->m_FlagCarrierRed;
              pCVar26 = (CNetObj_GameDataFlag *)((long)pCVar26 + (ulong)bVar39 * -8 + 4);
              pCVar29 = (CNetObj_Character *)((long)pCVar29 + (ulong)bVar39 * -8 + 4);
            }
            if ((this->m_Snap).m_aCharacters[lVar21].m_Cur.m_Weapon != 5) {
              iVar13 = *(int *)(pbVar1 + 0xa0);
              if (9 < iVar13) {
                iVar13 = 10;
              }
              if (iVar13 < 1) {
                iVar13 = 0;
              }
              *(int *)(pbVar1 + 0xa0) = iVar13;
            }
            if (piVar18 != (int *)0x0) {
              *pbVar1 = true;
              pCVar29 = (CNetObj_Character *)(pbVar1 + 4);
              piVar27 = piVar18;
              pCVar28 = pCVar29;
              for (lVar21 = 0x16; lVar21 != 0; lVar21 = lVar21 + -1) {
                (pCVar28->super_CNetObj_CharacterCore).m_Tick = *piVar27;
                piVar27 = piVar27 + (ulong)bVar39 * -2 + 1;
                pCVar28 = (CNetObj_Character *)((long)pCVar28 + (ulong)bVar39 * -8 + 4);
              }
              pIVar34 = this->m_pClient;
              iVar38 = pIVar34->m_GameTickSpeed * 3;
              iVar13 = (((CNetObj_Character *)(pbVar1 + 4))->super_CNetObj_CharacterCore).m_Tick +
                       iVar38;
              if (pIVar34->m_PrevGameTick <= iVar13) {
                iVar13 = pIVar34->m_PrevGameTick;
              }
              iVar38 = iVar38 + (((CNetObj_Character *)(pbVar1 + 0x5c))->super_CNetObj_CharacterCore
                                ).m_Tick;
              if (pIVar34->m_CurGameTick <= iVar38) {
                iVar38 = pIVar34->m_CurGameTick;
              }
              if (this->m_aClients[(int)CurrentServerInfo.m_NetAddr.type].m_Evolved.
                  super_CNetObj_CharacterCore.m_Tick == iVar13) {
                pCVar28 = &this->m_aClients[(int)CurrentServerInfo.m_NetAddr.type].m_Evolved;
                pCVar32 = pCVar29;
                for (lVar21 = 0x16; lVar21 != 0; lVar21 = lVar21 + -1) {
                  (pCVar32->super_CNetObj_CharacterCore).m_Tick =
                       (pCVar28->super_CNetObj_CharacterCore).m_Tick;
                  pCVar28 = (CNetObj_Character *)((long)pCVar28 + (ulong)bVar39 * -8 + 4);
                  pCVar32 = (CNetObj_Character *)((long)pCVar32 + (ulong)bVar39 * -8 + 4);
                }
                iVar15 = mem_comp(pCVar17,piVar18,0x58);
                if (iVar15 == 0) {
                  pCVar28 = &this->m_aClients[(int)CurrentServerInfo.m_NetAddr.type].m_Evolved;
                  pCVar32 = pCVar33;
                  for (lVar21 = 0x16; lVar21 != 0; lVar21 = lVar21 + -1) {
                    (pCVar32->super_CNetObj_CharacterCore).m_Tick =
                         (pCVar28->super_CNetObj_CharacterCore).m_Tick;
                    pCVar28 = (CNetObj_Character *)((long)pCVar28 + (ulong)bVar39 * -8 + 4);
                    pCVar32 = (CNetObj_Character *)((long)pCVar32 + (ulong)bVar39 * -8 + 4);
                  }
                }
              }
              if ((pCVar29->super_CNetObj_CharacterCore).m_Tick != 0) {
                EvolveCharacter(this,pCVar29,iVar13);
              }
              if ((pCVar33->super_CNetObj_CharacterCore).m_Tick != 0) {
                EvolveCharacter(this,pCVar33,iVar38);
              }
              pCVar29 = &(this->m_Snap).m_aCharacters[(int)CurrentServerInfo.m_NetAddr.type].m_Cur;
              pCVar33 = &this->m_aClients[(int)CurrentServerInfo.m_NetAddr.type].m_Evolved;
              for (lVar21 = 0x16; lVar21 != 0; lVar21 = lVar21 + -1) {
                (pCVar33->super_CNetObj_CharacterCore).m_Tick =
                     (pCVar29->super_CNetObj_CharacterCore).m_Tick;
                pCVar29 = (CNetObj_Character *)((long)pCVar29 + (ulong)bVar39 * -8 + 4);
                pCVar33 = (CNetObj_Character *)((long)pCVar33 + (ulong)bVar39 * -8 + 4);
              }
            }
            if ((CurrentServerInfo.m_NetAddr.type != this->m_LocalClientID) ||
               (this->m_pClient->m_State == 4)) {
              Pos.field_1.y = (float)(int)((ulong)*(undefined8 *)(pbVar1 + 0x60) >> 0x20);
              Pos.field_0.x = (float)(int)*(undefined8 *)(pbVar1 + 0x60);
              ProcessTriggeredEvents(this,*(int *)(pbVar1 + 0xb0),Pos);
            }
          }
          break;
        case 0xb:
          lVar21 = (long)(int)CurrentServerInfo.m_NetAddr.type;
          if ((lVar21 < 0x40) && (this->m_aClients[lVar21].m_Active == true)) {
            pcVar16 = this->m_aClients[lVar21].m_aName;
            (this->m_Snap).m_paPlayerInfos[lVar21] = (CNetObj_PlayerInfo *)pCVar17;
            (this->m_Snap).m_aInfoByScore[lVar21].m_pPlayerInfo = (CNetObj_PlayerInfo *)pCVar17;
            (this->m_Snap).m_aInfoByScore[lVar21].m_ClientID = CurrentServerInfo.m_NetAddr.type;
            if ((this->m_LocalClientID == CurrentServerInfo.m_NetAddr.type) &&
               ((this->m_Snap).m_pLocalInfo = (CNetObj_PlayerInfo *)pCVar17,
               *(int *)(pcVar16 + 0x308) == -1)) {
              (this->m_Snap).m_SpecInfo.m_Active = true;
              (this->m_Snap).m_SpecInfo.m_SpecMode = 0;
              (this->m_Snap).m_SpecInfo.m_SpectatorID = -1;
            }
            CClientData::UpdateBotRenderInfo
                      ((CClientData *)pcVar16,this,CurrentServerInfo.m_NetAddr.type);
          }
          break;
        case 0xc:
          (this->m_Snap).m_pSpectatorInfo = (CNetObj_SpectatorInfo *)pCVar17;
          iVar13 = (*(this->m_pClient->super_IInterface)._vptr_IInterface[0x1f])
                             (this->m_pClient,1,0xc,(ulong)CurrentServerInfo.m_NetAddr.type);
          (this->m_Snap).m_pPrevSpectatorInfo =
               (CNetObj_SpectatorInfo *)CONCAT44(extraout_var_01,iVar13);
          (this->m_Snap).m_SpecInfo.m_Active = true;
          pCVar5 = (this->m_Snap).m_pSpectatorInfo;
          iVar13 = pCVar5->m_SpectatorID;
          (this->m_Snap).m_SpecInfo.m_SpecMode = pCVar5->m_SpecMode;
          (this->m_Snap).m_SpecInfo.m_SpectatorID = iVar13;
          break;
        case 0x17:
          lVar21 = (long)(int)CurrentServerInfo.m_NetAddr.type;
          if ((lVar21 < 0x40) && (this->m_aClients[lVar21].m_Active == true)) {
            (this->m_Snap).m_paPlayerInfosRace[lVar21] = (CNetObj_PlayerInfoRace *)pCVar17;
          }
          break;
        case 0x18:
          (this->m_Snap).m_pGameDataRace = (CNetObj_GameDataRace *)pCVar17;
        }
      }
      uVar35 = (int)uVar36 + 1;
      uVar36 = (ulong)uVar35;
    } while (uVar35 != uVar12);
  }
  lVar21 = (long)this->m_LocalClientID;
  if (lVar21 < 0) {
    (this->m_Snap).m_SpecInfo.m_Active = true;
    if ((this->m_pClient->m_State == 4) &&
       (iVar13 = (*(this->m_pDemoPlayer->super_IInterface)._vptr_IInterface[10])(), iVar13 == 2)) {
      iVar13 = this->m_DemoSpecID;
      if (((long)iVar13 != -1) && ((this->m_Snap).m_aCharacters[iVar13].m_Active == true)) {
        (this->m_Snap).m_SpecInfo.m_SpecMode = 1;
        (this->m_Snap).m_SpecInfo.m_SpectatorID = iVar13;
        goto LAB_0018406c;
      }
    }
    if (this->m_DemoSpecMode == 1) {
      (this->m_Snap).m_SpecInfo.m_SpecMode = 0;
      (this->m_Snap).m_SpecInfo.m_SpectatorID = -1;
    }
    else {
      (this->m_Snap).m_SpecInfo.m_SpecMode = this->m_DemoSpecMode;
      (this->m_Snap).m_SpecInfo.m_SpectatorID = this->m_DemoSpecID;
    }
  }
  else if ((this->m_Snap).m_aCharacters[lVar21].m_Active == true) {
    if ((this->m_Snap).m_SpecInfo.m_Active == false) {
      (this->m_Snap).m_pLocalCharacter = &(this->m_Snap).m_aCharacters[lVar21].m_Cur;
      (this->m_Snap).m_pLocalPrevCharacter = &(this->m_Snap).m_aCharacters[lVar21].m_Prev;
      pCVar10 = (this->m_Snap).m_aCharacters + lVar21;
      uVar2 = (pCVar10->m_Cur).super_CNetObj_CharacterCore.m_X;
      uVar3 = (pCVar10->m_Cur).super_CNetObj_CharacterCore.m_Y;
      vVar8.field_1.y = (float)(int)uVar3;
      vVar8.field_0.x = (float)(int)uVar2;
      this->m_LocalCharacterPos = vVar8;
    }
  }
  else {
    iVar13 = (*(this->m_pClient->super_IInterface)._vptr_IInterface[0x1f])(this->m_pClient,1,10);
    if (CONCAT44(extraout_var_03,iVar13) != 0) {
      (*(this->m_pControls->super_CComponent)._vptr_CComponent[0xe])();
    }
  }
LAB_0018406c:
  pcVar37 = CompareTime;
  if (((this->m_GameInfo).m_GameFlags & 8) == 0) {
    pcVar37 = CompareScore;
  }
  iVar13 = 0;
  lVar21 = 0x3f0;
  do {
    lVar25 = 0;
    do {
      if ((*(long *)((long)&(this->m_Snap).m_aInfoByScore[1].m_pPlayerInfo + lVar25) != 0) &&
         ((*(long *)((long)&(this->m_Snap).m_aInfoByScore[0].m_pPlayerInfo + lVar25) == 0 ||
          (cVar11 = (*pcVar37)(), cVar11 != '\0')))) {
        puVar19 = (undefined8 *)((long)&(this->m_Snap).m_aInfoByScore[1].m_pPlayerInfo + lVar25);
        CurrentServerInfo._0_8_ =
             *(undefined8 *)((long)&(this->m_Snap).m_aInfoByScore[0].m_pPlayerInfo + lVar25);
        CurrentServerInfo.m_NetAddr.ip._0_8_ =
             *(undefined8 *)((long)&(this->m_Snap).m_aInfoByScore[0].m_ClientID + lVar25);
        uVar9 = *(undefined8 *)((long)&(this->m_Snap).m_aInfoByScore[1].m_ClientID + lVar25);
        *(undefined8 *)((long)&(this->m_Snap).m_aInfoByScore[0].m_pPlayerInfo + lVar25) = *puVar19;
        *(undefined8 *)((long)&(this->m_Snap).m_aInfoByScore[0].m_ClientID + lVar25) = uVar9;
        *puVar19 = CurrentServerInfo._0_8_;
        *(undefined8 *)((long)&(this->m_Snap).m_aInfoByScore[1].m_ClientID + lVar25) =
             CurrentServerInfo.m_NetAddr.ip._0_8_;
      }
      lVar25 = lVar25 + 0x10;
    } while (lVar21 != lVar25);
    iVar13 = iVar13 + 1;
    lVar21 = lVar21 + -0x10;
  } while (iVar13 != 0x3f);
  ppCVar20 = (this->m_Snap).m_paPlayerInfos;
  pCVar6 = (this->m_Snap).m_pGameData;
  this_00 = this->m_aClients;
  lVar21 = 0x909;
  do {
    pCVar7 = *ppCVar20;
    if (pCVar7 != (CNetObj_PlayerInfo *)0x0) {
      if ((((pCVar6 != (CNetObj_GameData *)0x0) && ((pCVar6->m_GameStateFlags & 0x31) != 0)) &&
          (pCVar6->m_GameStateEndTick == 0)) &&
         ((*(int *)((this->m_All).m_paComponents + lVar21 + -2) != -1 &&
          ((pCVar7->m_PlayerFlags & 8) == 0)))) {
        piVar18 = &(this->m_Snap).m_NotReadyCount;
        *piVar18 = *piVar18 + 1;
      }
      if (((((this->m_GameInfo).m_GameFlags & 4) != 0) &&
          (lVar25 = (long)*(int *)((this->m_All).m_paComponents + lVar21 + -2), lVar25 != -1)) &&
         ((pCVar7->m_PlayerFlags & 0x10) == 0)) {
        piVar18 = (this->m_Snap).m_AliveCount + lVar25;
        *piVar18 = *piVar18 + 1;
      }
    }
    ppCVar20 = ppCVar20 + 1;
    lVar21 = lVar21 + 0xb6;
  } while (lVar21 != 0x3689);
  pIVar34 = this->m_pClient;
  if (pIVar34->m_State == 4) {
    lVar21 = 0;
    do {
      if (this_00->m_Active == true) {
        CClientData::UpdateRenderInfo(this_00,this,(int)lVar21,true);
      }
      lVar21 = lVar21 + 1;
      this_00 = this_00 + 1;
    } while (lVar21 != 0x40);
    pIVar34 = this->m_pClient;
  }
  (*(pIVar34->super_IInterface)._vptr_IInterface[0x1d])(pIVar34,&CurrentServerInfo);
  pcVar16 = CurrentServerInfo.m_aGameType;
  iVar13 = str_comp(pcVar16,"DM");
  if ((((iVar13 == 0) || (iVar13 = str_comp(pcVar16,"TDM"), iVar13 == 0)) ||
      (iVar13 = str_comp(pcVar16,"CTF"), iVar13 == 0)) ||
     ((iVar13 = str_comp(pcVar16,"LMS"), iVar13 == 0 ||
      (iVar13 = str_comp(pcVar16,"LTS"), iVar13 == 0)))) {
    iVar13 = mem_comp(&Item,&this->m_Tuning,0x80);
    if (iVar13 == 0) {
      this->m_ServerMode = 0;
    }
    else {
      this->m_ServerMode = 2;
    }
  }
  else {
    this->m_ServerMode = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGameClient::OnNewSnapshot()
{
	// clear out the invalid pointers
	mem_zero(&m_Snap, sizeof(m_Snap));

	// secure snapshot
	{
		int Num = Client()->SnapNumItems(IClient::SNAP_CURRENT);
		for(int Index = 0; Index < Num; Index++)
		{
			IClient::CSnapItem Item;
			const void *pData = Client()->SnapGetItem(IClient::SNAP_CURRENT, Index, &Item);
			if(m_NetObjHandler.ValidateObj(Item.m_Type, pData, Item.m_DataSize) != 0)
			{
				if(Config()->m_Debug)
				{
					char aBuf[256];
					str_format(aBuf, sizeof(aBuf), "invalidated index=%d type=%d (%s) size=%d id=%d", Index, Item.m_Type, m_NetObjHandler.GetObjName(Item.m_Type), Item.m_DataSize, Item.m_ID);
					Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "game", aBuf);
				}
				Client()->SnapInvalidateItem(IClient::SNAP_CURRENT, Index);
			}
		}
	}

	ProcessEvents();

	if(Config()->m_DbgStress)
	{
		if((Client()->GameTick()%100) == 0)
		{
			char aMessage[64];
			int MsgLen = random_int()%(sizeof(aMessage)-1);
			for(int i = 0; i < MsgLen; i++)
				aMessage[i] = 'a'+(random_int()%('z'-'a'));
			aMessage[MsgLen] = 0;

			CNetMsg_Cl_Say Msg;
			Msg.m_Mode = random_int()&1;
			Msg.m_Target = -1;
			Msg.m_pMessage = aMessage;
			Client()->SendPackMsg(&Msg, MSGFLAG_VITAL);
		}
	}

	CTuningParams StandardTuning;
	if(Client()->State() == IClient::STATE_DEMOPLAYBACK)
	{
		m_Tuning = StandardTuning;
		mem_zero(&m_GameInfo, sizeof(m_GameInfo));
	}

	// go trough all the items in the snapshot and gather the info we want
	{
		int Num = Client()->SnapNumItems(IClient::SNAP_CURRENT);
		for(int i = 0; i < Num; i++)
		{
			IClient::CSnapItem Item;
			const void *pData = Client()->SnapGetItem(IClient::SNAP_CURRENT, i, &Item);

			// demo items
			if(Client()->State() == IClient::STATE_DEMOPLAYBACK)
			{
				if(Item.m_Type == NETOBJTYPE_DE_CLIENTINFO)
				{
					const CNetObj_De_ClientInfo *pInfo = (const CNetObj_De_ClientInfo *)pData;
					int ClientID = Item.m_ID;
					if(ClientID < MAX_CLIENTS)
					{
						CClientData *pClient = &m_aClients[ClientID];

						if(pInfo->m_Local)
							m_LocalClientID = ClientID;
						pClient->m_Active = true;
						pClient->m_Team  = pInfo->m_Team;
						IntsToStr(pInfo->m_aName, 4, pClient->m_aName);
						IntsToStr(pInfo->m_aClan, 3, pClient->m_aClan);
						pClient->m_Country = pInfo->m_Country;

						for(int p = 0; p < NUM_SKINPARTS; p++)
						{
							IntsToStr(pInfo->m_aaSkinPartNames[p], 6, pClient->m_aaSkinPartNames[p]);
							pClient->m_aUseCustomColors[p] = pInfo->m_aUseCustomColors[p];
							pClient->m_aSkinPartColors[p] = pInfo->m_aSkinPartColors[p];
						}

						m_GameInfo.m_NumPlayers++;
						// calculate team-balance
						if(pClient->m_Team != TEAM_SPECTATORS)
							m_GameInfo.m_aTeamSize[pClient->m_Team]++;
					}
				}
				else if(Item.m_Type == NETOBJTYPE_DE_GAMEINFO)
				{
					const CNetObj_De_GameInfo *pInfo = (const CNetObj_De_GameInfo *)pData;

					m_GameInfo.m_GameFlags = pInfo->m_GameFlags;
					m_GameInfo.m_ScoreLimit = pInfo->m_ScoreLimit;
					m_GameInfo.m_TimeLimit = pInfo->m_TimeLimit;
					m_GameInfo.m_MatchNum = pInfo->m_MatchNum;
					m_GameInfo.m_MatchCurrent = pInfo->m_MatchCurrent;
				}
				else if(Item.m_Type == NETOBJTYPE_DE_TUNEPARAMS)
				{
					const CNetObj_De_TuneParams *pInfo = (const CNetObj_De_TuneParams *)pData;

					mem_copy(&m_Tuning, pInfo->m_aTuneParams, sizeof(m_Tuning));
					m_ServerMode = SERVERMODE_PURE;
				}
			}

			// network items
			if(Item.m_Type == NETOBJTYPE_PLAYERINFO)
			{
				const CNetObj_PlayerInfo *pInfo = (const CNetObj_PlayerInfo *)pData;
				int ClientID = Item.m_ID;
				if(ClientID < MAX_CLIENTS && m_aClients[ClientID].m_Active)
				{
					m_Snap.m_paPlayerInfos[ClientID] = pInfo;
					m_Snap.m_aInfoByScore[ClientID].m_pPlayerInfo = pInfo;
					m_Snap.m_aInfoByScore[ClientID].m_ClientID = ClientID;

					if(m_LocalClientID == ClientID)
					{
						m_Snap.m_pLocalInfo = pInfo;

						if(m_aClients[ClientID].m_Team == TEAM_SPECTATORS)
						{
							m_Snap.m_SpecInfo.m_Active = true;
							m_Snap.m_SpecInfo.m_SpecMode = SPEC_FREEVIEW;
							m_Snap.m_SpecInfo.m_SpectatorID = -1;
						}
					}
					m_aClients[ClientID].UpdateBotRenderInfo(this, ClientID);
				}
			}
			else if(Item.m_Type == NETOBJTYPE_PLAYERINFORACE)
			{
				const CNetObj_PlayerInfoRace *pInfo = (const CNetObj_PlayerInfoRace *)pData;
				int ClientID = Item.m_ID;
				if(ClientID < MAX_CLIENTS && m_aClients[ClientID].m_Active)
				{
					m_Snap.m_paPlayerInfosRace[ClientID] = pInfo;
				}
			}
			else if(Item.m_Type == NETOBJTYPE_CHARACTER)
			{
				if(Item.m_ID < MAX_CLIENTS)
				{
					CSnapState::CCharacterInfo *pCharInfo = &m_Snap.m_aCharacters[Item.m_ID];
					const void *pOld = Client()->SnapFindItem(IClient::SNAP_PREV, NETOBJTYPE_CHARACTER, Item.m_ID);
					pCharInfo->m_Cur = *((const CNetObj_Character *)pData);

					// clamp ammo count for non ninja weapon
					if(pCharInfo->m_Cur.m_Weapon != WEAPON_NINJA)
						pCharInfo->m_Cur.m_AmmoCount = clamp(pCharInfo->m_Cur.m_AmmoCount, 0, 10);

					if(pOld)
					{
						pCharInfo->m_Active = true;
						pCharInfo->m_Prev = *((const CNetObj_Character *)pOld);

						// limit evolving to 3 seconds
						int EvolvePrevTick = minimum(pCharInfo->m_Prev.m_Tick + Client()->GameTickSpeed()*3, Client()->PrevGameTick());
						int EvolveCurTick = minimum(pCharInfo->m_Cur.m_Tick + Client()->GameTickSpeed()*3, Client()->GameTick());

						// reuse the evolved char
						if(m_aClients[Item.m_ID].m_Evolved.m_Tick == EvolvePrevTick)
						{
							pCharInfo->m_Prev = m_aClients[Item.m_ID].m_Evolved;
							if(mem_comp(pData, pOld, sizeof(CNetObj_Character)) == 0)
								pCharInfo->m_Cur = m_aClients[Item.m_ID].m_Evolved;
						}

						if(pCharInfo->m_Prev.m_Tick)
							EvolveCharacter(&pCharInfo->m_Prev, EvolvePrevTick);
						if(pCharInfo->m_Cur.m_Tick)
							EvolveCharacter(&pCharInfo->m_Cur, EvolveCurTick);
						
						m_aClients[Item.m_ID].m_Evolved = m_Snap.m_aCharacters[Item.m_ID].m_Cur;
					}

					if(Item.m_ID != m_LocalClientID || Client()->State() == IClient::STATE_DEMOPLAYBACK)
						ProcessTriggeredEvents(pCharInfo->m_Cur.m_TriggeredEvents, vec2(pCharInfo->m_Cur.m_X, pCharInfo->m_Cur.m_Y));
				}
			}
			else if(Item.m_Type == NETOBJTYPE_SPECTATORINFO)
			{
				m_Snap.m_pSpectatorInfo = (const CNetObj_SpectatorInfo *)pData;
				m_Snap.m_pPrevSpectatorInfo = (const CNetObj_SpectatorInfo *)Client()->SnapFindItem(IClient::SNAP_PREV, NETOBJTYPE_SPECTATORINFO, Item.m_ID);
				m_Snap.m_SpecInfo.m_Active = true;
				m_Snap.m_SpecInfo.m_SpecMode = m_Snap.m_pSpectatorInfo->m_SpecMode;
				m_Snap.m_SpecInfo.m_SpectatorID = m_Snap.m_pSpectatorInfo->m_SpectatorID;
			}
			else if(Item.m_Type == NETOBJTYPE_GAMEDATA)
			{
				m_Snap.m_pGameData = (const CNetObj_GameData *)pData;

				static int s_LastGameFlags = 0;
				int GameFlags = m_Snap.m_pGameData->m_GameStateFlags;
				if(!(s_LastGameFlags&GAMESTATEFLAG_GAMEOVER) && GameFlags&GAMESTATEFLAG_GAMEOVER)
					OnGameOver();
				else if(s_LastGameFlags&GAMESTATEFLAG_GAMEOVER && !(GameFlags&GAMESTATEFLAG_GAMEOVER))
					OnStartGame();

				// stats
				if(m_Snap.m_pGameData->m_GameStartTick != m_LastGameStartTick && !(s_LastGameFlags&GAMESTATEFLAG_ROUNDOVER)
					&& !(s_LastGameFlags&GAMESTATEFLAG_PAUSED) && (!(GameFlags&GAMESTATEFLAG_PAUSED) || GameFlags&GAMESTATEFLAG_STARTCOUNTDOWN))
				{
					m_pStats->OnMatchStart();
				}

				if(!(GameFlags&(GAMESTATEFLAG_PAUSED|GAMESTATEFLAG_ROUNDOVER|GAMESTATEFLAG_GAMEOVER)))
					m_pStats->UpdatePlayTime(Client()->GameTick() - Client()->PrevGameTick());

				s_LastGameFlags = GameFlags;
				m_LastGameStartTick = m_Snap.m_pGameData->m_GameStartTick;
			}
			else if(Item.m_Type == NETOBJTYPE_GAMEDATATEAM)
			{
				m_Snap.m_pGameDataTeam = (const CNetObj_GameDataTeam *)pData;
			}
			else if(Item.m_Type == NETOBJTYPE_GAMEDATAFLAG)
			{
				m_Snap.m_pGameDataFlag = (const CNetObj_GameDataFlag *)pData;
				m_Snap.m_GameDataFlagSnapID = Item.m_ID;

				// stats
				if(m_LastFlagCarrierRed == FLAG_ATSTAND && m_Snap.m_pGameDataFlag->m_FlagCarrierRed >= 0)
					m_pStats->OnFlagGrab(m_Snap.m_pGameDataFlag->m_FlagCarrierRed);
				else if(m_LastFlagCarrierBlue == FLAG_ATSTAND && m_Snap.m_pGameDataFlag->m_FlagCarrierBlue >= 0)
					m_pStats->OnFlagGrab(m_Snap.m_pGameDataFlag->m_FlagCarrierBlue);

				m_LastFlagCarrierRed = m_Snap.m_pGameDataFlag->m_FlagCarrierRed;
				m_LastFlagCarrierBlue = m_Snap.m_pGameDataFlag->m_FlagCarrierBlue;
			}
			else if(Item.m_Type == NETOBJTYPE_GAMEDATARACE)
			{
				m_Snap.m_pGameDataRace = (const CNetObj_GameDataRace *)pData;
			}
			else if(Item.m_Type == NETOBJTYPE_FLAG)
			{
				m_Snap.m_paFlags[Item.m_ID%2] = (const CNetObj_Flag *)pData;
			}
		}
	}

	// setup local pointers
	if(m_LocalClientID >= 0)
	{
		CSnapState::CCharacterInfo *c = &m_Snap.m_aCharacters[m_LocalClientID];
		if(c->m_Active)
		{
			if (!m_Snap.m_SpecInfo.m_Active)
			{
				m_Snap.m_pLocalCharacter = &c->m_Cur;
				m_Snap.m_pLocalPrevCharacter = &c->m_Prev;
				m_LocalCharacterPos = vec2(m_Snap.m_pLocalCharacter->m_X, m_Snap.m_pLocalCharacter->m_Y);
			}
		}
		else if(Client()->SnapFindItem(IClient::SNAP_PREV, NETOBJTYPE_CHARACTER, m_LocalClientID))
		{
			// player died
			m_pControls->OnPlayerDeath();
		}
	}
	else
	{
		m_Snap.m_SpecInfo.m_Active = true;
		if(Client()->State() == IClient::STATE_DEMOPLAYBACK && DemoPlayer()->GetDemoType() == IDemoPlayer::DEMOTYPE_SERVER &&
			m_DemoSpecID != -1 && m_Snap.m_aCharacters[m_DemoSpecID].m_Active)
		{
			m_Snap.m_SpecInfo.m_SpecMode = SPEC_PLAYER;
			m_Snap.m_SpecInfo.m_SpectatorID = m_DemoSpecID;
		}
		else
		{
			if (m_DemoSpecMode == SPEC_PLAYER)
			{
				m_Snap.m_SpecInfo.m_SpecMode = SPEC_FREEVIEW;
				m_Snap.m_SpecInfo.m_SpectatorID = -1;
			}
			else
			{
				m_Snap.m_SpecInfo.m_SpecMode = m_DemoSpecMode;
				m_Snap.m_SpecInfo.m_SpectatorID = m_DemoSpecID;
			}
		}
	}

	// sort player infos by score
	FCompareFunc Compare = (m_GameInfo.m_GameFlags&GAMEFLAG_RACE) ? CompareTime : CompareScore;

	for(int k = 0; k < MAX_CLIENTS-1; k++) // ffs, bubblesort
	{
		for(int i = 0; i < MAX_CLIENTS-k-1; i++)
		{
			if(m_Snap.m_aInfoByScore[i+1].m_pPlayerInfo && (!m_Snap.m_aInfoByScore[i].m_pPlayerInfo ||
				Compare(m_Snap.m_aInfoByScore[i].m_pPlayerInfo, m_Snap.m_aInfoByScore[i+1].m_pPlayerInfo)))
			{
				CPlayerInfoItem Tmp = m_Snap.m_aInfoByScore[i];
				m_Snap.m_aInfoByScore[i] = m_Snap.m_aInfoByScore[i+1];
				m_Snap.m_aInfoByScore[i+1] = Tmp;
			}
		}
	}

	// calc some player stats
	for(int i = 0; i < MAX_CLIENTS; ++i)
	{
		if(!m_Snap.m_paPlayerInfos[i])
			continue;

		// count not ready players
		if(m_Snap.m_pGameData && (m_Snap.m_pGameData->m_GameStateFlags&(GAMESTATEFLAG_STARTCOUNTDOWN|GAMESTATEFLAG_PAUSED|GAMESTATEFLAG_WARMUP)) &&
			m_Snap.m_pGameData->m_GameStateEndTick == 0 && m_aClients[i].m_Team != TEAM_SPECTATORS && !(m_Snap.m_paPlayerInfos[i]->m_PlayerFlags&PLAYERFLAG_READY))
			m_Snap.m_NotReadyCount++;

		// count alive players per team
		if((m_GameInfo.m_GameFlags&GAMEFLAG_SURVIVAL) && m_aClients[i].m_Team != TEAM_SPECTATORS && !(m_Snap.m_paPlayerInfos[i]->m_PlayerFlags&PLAYERFLAG_DEAD))
			m_Snap.m_AliveCount[m_aClients[i].m_Team]++;
	}

	if(Client()->State() == IClient::STATE_DEMOPLAYBACK)
	{
		for(int i = 0; i < MAX_CLIENTS; ++i)
		{
			if(m_aClients[i].m_Active)
				m_aClients[i].UpdateRenderInfo(this, i, true);
		}
	}

	CServerInfo CurrentServerInfo;
	Client()->GetServerInfo(&CurrentServerInfo);
	if(str_comp(CurrentServerInfo.m_aGameType, "DM") != 0 && str_comp(CurrentServerInfo.m_aGameType, "TDM") != 0 && str_comp(CurrentServerInfo.m_aGameType, "CTF") != 0 &&
		str_comp(CurrentServerInfo.m_aGameType, "LMS") != 0 && str_comp(CurrentServerInfo.m_aGameType, "LTS") != 0)
		m_ServerMode = SERVERMODE_MOD;
	else if(mem_comp(&StandardTuning, &m_Tuning, sizeof(CTuningParams)) == 0)
		m_ServerMode = SERVERMODE_PURE;
	else
		m_ServerMode = SERVERMODE_PUREMOD;
}